

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

Node * YAML::Clone(Node *__return_storage_ptr__,Node *node)

{
  NodeEvents events;
  NodeBuilder builder;
  NodeEvents NStack_c8;
  NodeBuilder local_80;
  
  NodeEvents::NodeEvents(&NStack_c8,node);
  NodeBuilder::NodeBuilder(&local_80);
  NodeEvents::Emit(&NStack_c8,&local_80.super_EventHandler);
  NodeBuilder::Root(__return_storage_ptr__,&local_80);
  NodeBuilder::~NodeBuilder(&local_80);
  std::
  _Rb_tree<const_YAML::detail::node_ref_*,_std::pair<const_YAML::detail::node_ref_*const,_int>,_std::_Select1st<std::pair<const_YAML::detail::node_ref_*const,_int>_>,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
  ::~_Rb_tree(&NStack_c8.m_refCount._M_t);
  if (NStack_c8.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (NStack_c8.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Clone(const Node& node) {
  NodeEvents events(node);
  NodeBuilder builder;
  events.Emit(builder);
  return builder.Root();
}